

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O3

ShaderResourceDesc __thiscall
Diligent::ShaderResourcesGL::GetResourceDesc(ShaderResourcesGL *this,Uint32 Index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Uint32 Index_00;
  TextureInfo *pTVar4;
  Char *pCVar5;
  SHADER_RESOURCE_TYPE SVar6;
  Uint32 Index_01;
  ulong uVar7;
  ShaderResourceDesc SVar8;
  string _msg;
  Uint32 local_2c;
  string local_28;
  
  uVar1 = this->m_NumUniformBuffers;
  uVar2 = this->m_NumTextures;
  uVar3 = this->m_NumImages;
  local_2c = Index;
  if (Index < uVar3 + this->m_NumStorageBlocks + uVar2 + uVar1) {
    Index_00 = Index - uVar1;
    if (Index < uVar1) {
      pTVar4 = (TextureInfo *)GetUniformBuffer(this,Index);
    }
    else {
      Index_01 = Index_00 - uVar2;
      if (Index_00 < uVar2) {
        pTVar4 = GetTexture(this,Index_00);
      }
      else if (Index_01 < uVar3) {
        pTVar4 = (TextureInfo *)GetImage(this,Index_01);
      }
      else {
        if (this->m_NumStorageBlocks <= Index_01 - uVar3) {
          FormatString<char[53]>
                    (&local_28,(char (*) [53])"This should never be executed - appears to be a bug."
                    );
          DebugAssertionFailed
                    (local_28._M_dataplus._M_p,"GetResourceDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x36f);
          goto LAB_001ac47c;
        }
        pTVar4 = (TextureInfo *)GetStorageBlock(this,Index_01 - uVar3);
      }
    }
    pCVar5 = (pTVar4->super_GLResourceAttribs).Name;
    uVar7 = (ulong)(pTVar4->super_GLResourceAttribs).ArraySize;
    SVar6 = (pTVar4->super_GLResourceAttribs).ResourceType;
  }
  else {
    FormatString<char[16],unsigned_int,char[12]>
              (&local_28,(Diligent *)"Resource index ",(char (*) [16])&local_2c,(uint *)0x341d45,
               (char (*) [12])(ulong)uVar2);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_28._M_dataplus._M_p,0,0,0);
    }
LAB_001ac47c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    uVar7 = 0;
    SVar6 = SHADER_RESOURCE_TYPE_UNKNOWN;
    pCVar5 = (Char *)0x0;
  }
  SVar8._8_8_ = (ulong)SVar6 | uVar7 << 0x20;
  SVar8.Name = pCVar5;
  return SVar8;
}

Assistant:

ShaderResourceDesc ShaderResourcesGL::GetResourceDesc(Uint32 Index) const
{
    if (Index >= GetVariableCount())
    {
        LOG_ERROR_MESSAGE("Resource index ", Index, " is invalid");
        return ShaderResourceDesc{};
    }

    if (Index < m_NumUniformBuffers)
        return GetUniformBuffer(Index).GetResourceDesc();
    else
        Index -= m_NumUniformBuffers;

    if (Index < m_NumTextures)
        return GetTexture(Index).GetResourceDesc();
    else
        Index -= m_NumTextures;

    if (Index < m_NumImages)
        return GetImage(Index).GetResourceDesc();
    else
        Index -= m_NumImages;

    if (Index < m_NumStorageBlocks)
        return GetStorageBlock(Index).GetResourceDesc();
    else
        Index -= m_NumStorageBlocks;

    UNEXPECTED("This should never be executed - appears to be a bug.");
    return ShaderResourceDesc{};
}